

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QString * __thiscall
QUrl::fileName(QString *__return_storage_ptr__,QUrl *this,ComponentFormattingOptions options)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  path((QString *)&local_38,this,options);
  qVar1 = QString::lastIndexOf((QString *)&local_38,(QChar)0x2f,CaseSensitive);
  if (qVar1 == -1) {
    (__return_storage_ptr__->d).d = local_38.d;
    (__return_storage_ptr__->d).ptr = local_38.ptr;
    (__return_storage_ptr__->d).size = local_38.size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    QString::mid(__return_storage_ptr__,(QString *)&local_38,qVar1 + 1,-1);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrl::fileName(ComponentFormattingOptions options) const
{
    const QString ourPath = path(options);
    const qsizetype slash = ourPath.lastIndexOf(u'/');
    if (slash == -1)
        return ourPath;
    return ourPath.mid(slash + 1);
}